

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O2

void __thiscall
CP::priority_queue<int,_bool_(*)(const_int_&,_const_int_&)>::fixDown
          (priority_queue<int,_bool_(*)(const_int_&,_const_int_&)> *this,size_t idx)

{
  bool bVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  int tmp;
  int local_2c;
  
  piVar2 = this->mData;
  local_2c = piVar2[idx];
  while( true ) {
    uVar3 = idx * 2 + 1;
    if (this->mSize <= uVar3) break;
    uVar4 = idx * 2 + 2;
    if (uVar4 < this->mSize) {
      bVar1 = (*this->mLess)(piVar2 + uVar3,piVar2 + uVar4);
      if (!bVar1) {
        uVar4 = uVar3;
      }
      uVar3 = uVar4;
      piVar2 = this->mData;
    }
    bVar1 = (*this->mLess)(piVar2 + uVar3,&local_2c);
    piVar2 = this->mData;
    if (bVar1) break;
    piVar2[idx] = piVar2[uVar3];
    idx = uVar3;
  }
  piVar2[idx] = local_2c;
  return;
}

Assistant:

void fixDown(size_t idx) {
      T tmp = mData[idx];
      size_t c;
      while ((c = 2 * idx + 1) < mSize) {
        if (c + 1 < mSize && mLess(mData[c],mData[c + 1]) ) c++;
        if ( mLess(mData[c],tmp) ) break;
        mData[idx] = mData[c];
        idx = c;
      }
      mData[idx] = tmp;
    }